

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O0

MutableSubtree
ts_subtree_new_node(SubtreePool *pool,TSSymbol symbol,SubtreeArray *children,uint alias_sequence_id,
                   TSLanguage *language)

{
  MutableSubtree MVar1;
  MutableSubtree MVar2;
  bool local_a1;
  undefined4 local_a0;
  undefined4 uStack_9c;
  TSPoint TStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  TSSymbol TStack_78;
  undefined2 uStack_76;
  ushort uStack_74;
  undefined2 uStack_72;
  Subtree *local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined4 uStack_58;
  undefined2 uStack_54;
  undefined2 uStack_52;
  undefined8 local_50;
  MutableSubtree local_48;
  SubtreeHeapData *data;
  _Bool fragile;
  TSLanguage *pTStack_38;
  TSSymbolMetadata metadata;
  TSLanguage *language_local;
  uint alias_sequence_id_local;
  SubtreeArray *children_local;
  TSSymbol symbol_local;
  SubtreePool *pool_local;
  MutableSubtree result;
  
  pTStack_38 = language;
  data._7_1_ = ts_language_symbol_metadata(language,symbol);
  local_a1 = 0xfffd < symbol;
  data._6_1_ = local_a1;
  MVar2.ptr = ts_subtree_pool_allocate(pool);
  local_48.ptr = MVar2.ptr;
  memset(&local_a0,0,0x58);
  MVar1 = local_48;
  local_a0 = 1;
  uStack_74 = uStack_74 & 0xffe4 | (ushort)((byte)data._7_1_ & 1) |
              (ushort)((byte)data._7_1_ >> 1 & 1) << 1 | (ushort)(data._6_1_ & 1) << 3 |
              (ushort)(data._6_1_ & 1) << 4;
  uStack_54 = (undefined2)alias_sequence_id;
  *(undefined8 *)((long)&(MVar2.ptr)->field_17 + 0x20) = local_50;
  *(undefined8 *)((long)&(MVar2.ptr)->field_17 + 0x10) = local_60;
  *(ulong *)((long)&(MVar2.ptr)->field_17 + 0x18) =
       CONCAT26(uStack_52,CONCAT24(uStack_54,uStack_58));
  ((MVar2.ptr)->field_17).field_0.children = local_70;
  *(undefined8 *)((long)&(MVar2.ptr)->field_17 + 8) = uStack_68;
  *(undefined4 *)((long)MVar2 + 0x20) = (undefined4)local_80;
  *(undefined4 *)((long)MVar2 + 0x24) = local_80._4_4_;
  *(TSSymbol *)((long)MVar2 + 0x28) = symbol;
  *(undefined2 *)((long)MVar2 + 0x2a) = uStack_76;
  *(int *)((long)MVar2 + 0x2c) =
       (int)(CONCAT26(uStack_72,CONCAT24(uStack_74,CONCAT22(uStack_76,symbol))) >> 0x20);
  ((Length *)((long)MVar2 + 0x10))->bytes = (undefined4)local_90;
  (((Length *)((long)MVar2 + 0x10))->extent).row = local_90._4_4_;
  *(undefined8 *)&((MVar2.ptr)->size).extent.column = uStack_88;
  *(uint32_t *)MVar2 = 1;
  ((Length *)((long)MVar2 + 4))->bytes = uStack_9c;
  ((MVar2.ptr)->padding).extent = TStack_98;
  TStack_78 = symbol;
  ts_subtree_set_children(local_48,children->contents,children->size,pTStack_38);
  return (MutableSubtree)MVar1.data;
}

Assistant:

MutableSubtree ts_subtree_new_node(SubtreePool *pool, TSSymbol symbol,
                                   SubtreeArray *children, unsigned alias_sequence_id,
                                   const TSLanguage *language) {
  TSSymbolMetadata metadata = ts_language_symbol_metadata(language, symbol);
  bool fragile = symbol == ts_builtin_sym_error || symbol == ts_builtin_sym_error_repeat;
  SubtreeHeapData *data = ts_subtree_pool_allocate(pool);
  *data = (SubtreeHeapData) {
    .ref_count = 1,
    .symbol = symbol,
    .alias_sequence_id = alias_sequence_id,
    .visible = metadata.visible,
    .named = metadata.named,
    .has_changes = false,
    .fragile_left = fragile,
    .fragile_right = fragile,
    .is_keyword = false,
    .node_count = 0,
    .first_leaf = {.symbol = 0, .parse_state = 0},
  };
  MutableSubtree result = {.ptr = data};
  ts_subtree_set_children(result, children->contents, children->size, language);
  return result;
}